

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O2

void __thiscall
cbtCollisionWorld::addCollisionObject
          (cbtCollisionWorld *this,cbtCollisionObject *collisionObject,int collisionFilterGroup,
          int collisionFilterMask)

{
  cbtCollisionObject *pcVar1;
  int iVar2;
  undefined4 extraout_var;
  cbtCollisionObject *collisionObject_local;
  cbtVector3 maxAabb;
  cbtVector3 minAabb;
  cbtTransform trans;
  
  collisionObject->m_worldArrayIndex = (this->m_collisionObjects).m_size;
  collisionObject_local = collisionObject;
  cbtAlignedObjectArray<cbtCollisionObject_*>::push_back
            (&this->m_collisionObjects,&collisionObject_local);
  trans.m_basis.m_el[0].m_floats._0_8_ =
       *(undefined8 *)(collisionObject_local->m_worldTransform).m_basis.m_el[0].m_floats;
  trans.m_basis.m_el[0].m_floats._8_8_ =
       *(undefined8 *)((collisionObject_local->m_worldTransform).m_basis.m_el[0].m_floats + 2);
  trans.m_basis.m_el[1].m_floats._0_8_ =
       *(undefined8 *)(collisionObject_local->m_worldTransform).m_basis.m_el[1].m_floats;
  trans.m_basis.m_el[1].m_floats._8_8_ =
       *(undefined8 *)((collisionObject_local->m_worldTransform).m_basis.m_el[1].m_floats + 2);
  trans.m_basis.m_el[2].m_floats._0_8_ =
       *(undefined8 *)(collisionObject_local->m_worldTransform).m_basis.m_el[2].m_floats;
  trans.m_basis.m_el[2].m_floats._8_8_ =
       *(undefined8 *)((collisionObject_local->m_worldTransform).m_basis.m_el[2].m_floats + 2);
  trans.m_origin.m_floats._0_8_ =
       *(undefined8 *)(collisionObject_local->m_worldTransform).m_origin.m_floats;
  trans.m_origin.m_floats._8_8_ =
       *(undefined8 *)((collisionObject_local->m_worldTransform).m_origin.m_floats + 2);
  (*collisionObject_local->m_collisionShape->_vptr_cbtCollisionShape[2])
            (collisionObject_local->m_collisionShape,&trans,&minAabb,&maxAabb);
  pcVar1 = collisionObject_local;
  iVar2 = (*this->m_broadphasePairCache->_vptr_cbtBroadphaseInterface[2])
                    (this->m_broadphasePairCache,&minAabb,&maxAabb,
                     (ulong)(uint)collisionObject_local->m_collisionShape->m_shapeType,
                     collisionObject_local,(ulong)(uint)collisionFilterGroup,
                     (ulong)(uint)collisionFilterMask,this->m_dispatcher1);
  pcVar1->m_broadphaseHandle = (cbtBroadphaseProxy *)CONCAT44(extraout_var,iVar2);
  return;
}

Assistant:

void cbtCollisionWorld::addCollisionObject(cbtCollisionObject* collisionObject, int collisionFilterGroup, int collisionFilterMask)
{
	cbtAssert(collisionObject);

	//check that the object isn't already added
	cbtAssert(m_collisionObjects.findLinearSearch(collisionObject) == m_collisionObjects.size());
	cbtAssert(collisionObject->getWorldArrayIndex() == -1);  // do not add the same object to more than one collision world

	collisionObject->setWorldArrayIndex(m_collisionObjects.size());
	m_collisionObjects.push_back(collisionObject);

	//calculate new AABB
	cbtTransform trans = collisionObject->getWorldTransform();

	cbtVector3 minAabb;
	cbtVector3 maxAabb;
	collisionObject->getCollisionShape()->getAabb(trans, minAabb, maxAabb);

	int type = collisionObject->getCollisionShape()->getShapeType();
	collisionObject->setBroadphaseHandle(getBroadphase()->createProxy(
		minAabb,
		maxAabb,
		type,
		collisionObject,
		collisionFilterGroup,
		collisionFilterMask,
		m_dispatcher1));
}